

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O2

Plane<3> *
r3d::tet_face_from_verts(Plane<3> *__return_storage_ptr__,Vector<3> *a,Vector<3> *b,Vector<3> *c)

{
  Real RVar1;
  Vector<3> normal;
  Vector<3> center;
  Few<double,_3> local_1b0;
  Few<double,_3> local_198;
  Few<double,_3> local_180;
  Few<double,_3> local_168;
  Vector<3> local_150;
  Few<double,_3> local_138;
  Few<double,_3> local_120;
  Vector<3> local_108;
  Vector<3> local_f0;
  Few<double,_3> local_d8;
  Few<double,_3> local_c0;
  Few<double,_3> local_a8;
  Few<double,_3> local_90;
  Vector<3> local_78;
  Vector<3> local_60;
  Few<double,_3> local_48;
  
  Few<double,_3>::Few(&local_90,&a->super_Few<double,_3>);
  Few<double,_3>::Few(&local_a8,&b->super_Few<double,_3>);
  operator+(&local_78,(Vector<3> *)&local_90,(Vector<3> *)&local_a8);
  Few<double,_3>::Few(&local_c0,&c->super_Few<double,_3>);
  operator+(&local_60,&local_78,(Vector<3> *)&local_c0);
  operator*((Vector<3> *)&local_48,0.3333333333333333,&local_60);
  Few<double,_3>::Few(&local_120,&b->super_Few<double,_3>);
  Few<double,_3>::Few(&local_138,&a->super_Few<double,_3>);
  operator-(&local_108,(Vector<3> *)&local_120,(Vector<3> *)&local_138);
  Few<double,_3>::Few(&local_168,&c->super_Few<double,_3>);
  Few<double,_3>::Few(&local_180,&a->super_Few<double,_3>);
  operator-(&local_150,(Vector<3> *)&local_168,(Vector<3> *)&local_180);
  cross(&local_f0,&local_108,&local_150);
  normalize<3>((Vector<3> *)&local_d8,&local_f0);
  Few<double,_3>::Few(&local_198,&local_d8);
  Few<double,_3>::Few(&local_1b0,&local_48);
  RVar1 = operator*((Vector<3> *)&local_198,(Vector<3> *)&local_1b0);
  Few<double,_3>::Few((Few<double,_3> *)__return_storage_ptr__,&local_d8);
  __return_storage_ptr__->d = -RVar1;
  return __return_storage_ptr__;
}

Assistant:

R3D_INLINE Plane<3> tet_face_from_verts(Vector<3> a, Vector<3> b, Vector<3> c) {
  auto center = ONE_THIRD * (a + b + c);
  auto normal = normalize(cross((b - a), (c - a)));
  auto d = -(normal * center);
  return Plane<3>{normal, d};
}